

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

OASIS_FLOAT __thiscall gulcalc::getgul(gulcalc *this,damagebindictionary *b,gulGulSamples *g)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double cc;
  double bb;
  double aa;
  double bin_height;
  double bin_width;
  int z;
  double x;
  OASIS_FLOAT gul;
  gulGulSamples *g_local;
  damagebindictionary *b_local;
  gulcalc *this_local;
  
  if ((b->bin_from != b->bin_to) || (NAN(b->bin_from) || NAN(b->bin_to))) {
    dVar2 = (double)((g->bin_mean - b->bin_from) / (b->bin_to - b->bin_from));
    dVar3 = round(dVar2 * 100000.0);
    if ((int)dVar3 == 50000) {
      this_local._4_4_ =
           (float)((((g->rval - (double)g->prob_from) / (double)(g->prob_to - g->prob_from)) *
                    (double)(b->bin_to - b->bin_from) + (double)b->bin_from) * (double)g->tiv);
    }
    else {
      dVar3 = (double)(b->bin_to - b->bin_from);
      dVar4 = (double)(g->prob_to - g->prob_from);
      dVar5 = ((dVar4 * 3.0) / (dVar3 * dVar3)) * (dVar2 + dVar2 + -1.0);
      dVar2 = ((dVar4 * 2.0) / dVar3) * (dVar2 * -3.0 + 2.0);
      fVar1 = b->bin_from;
      dVar3 = sqrt(dVar2 * dVar2 + -(dVar5 * 4.0 * ((double)g->prob_from - g->rval)));
      this_local._4_4_ = (float)(((double)fVar1 + (dVar3 - dVar2) / (dVar5 * 2.0)) * (double)g->tiv)
      ;
    }
  }
  else {
    this_local._4_4_ = b->bin_to * g->tiv;
  }
  return this_local._4_4_;
}

Assistant:

OASIS_FLOAT gulcalc::getgul(damagebindictionary &b, gulGulSamples &g)
{
	OASIS_FLOAT gul = 0;
	if (b.bin_from == b.bin_to) {
		gul = b.bin_to * g.tiv;
		return gul;
	}

	double x = (g.bin_mean - b.bin_from) / (b.bin_to - b.bin_from);
	int z = (int) (round(x * 100000));
	if (z == 50000) {
		gul = (b.bin_from + ((g.rval - g.prob_from) / (g.prob_to - g.prob_from) * (b.bin_to - b.bin_from))) * g.tiv;
		return gul;
	}

	double bin_width = b.bin_to - b.bin_from;
	double bin_height = g.prob_to - g.prob_from;

	double aa = (3 * bin_height / (bin_width * bin_width)) * ((2 * x) - 1);

	double bb = (2 * bin_height / bin_width) * (2 - (3* x)) ;

	double cc = g.prob_from - g.rval;
	gul = (b.bin_from + (sqrt(bb*bb - (4 * aa*cc)) - bb) / (2 * aa)) * g.tiv;

	return gul;
}